

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_move_32_aw_pcix(void)

{
  uint uVar1;
  uint value;
  uint uVar2;
  
  m68ki_address_space = 2;
  uVar1 = m68ki_get_ea_ix(m68ki_cpu.pc);
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar1 = pmmu_translate_addr(uVar1);
  }
  value = m68k_read_memory_32(uVar1 & m68ki_cpu.address_mask);
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar1 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar1 = pmmu_translate_addr(uVar1);
  }
  uVar2 = m68k_read_memory_16(uVar1 & m68ki_cpu.address_mask);
  uVar1 = (uint)(short)uVar2;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar1 = pmmu_translate_addr(uVar1);
  }
  m68k_write_memory_32(uVar1 & m68ki_cpu.address_mask,value);
  m68ki_cpu.n_flag = value >> 0x18;
  m68ki_cpu.not_z_flag = value;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_move_32_aw_pcix(void)
{
	uint res = OPER_PCIX_32();
	uint ea = EA_AW_32();

	m68ki_write_32(ea, res);

	FLAG_N = NFLAG_32(res);
	FLAG_Z = res;
	FLAG_V = VFLAG_CLEAR;
	FLAG_C = CFLAG_CLEAR;
}